

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::PrintToString(Printer *this,Message *message,string *output)

{
  bool bVar1;
  LogMessage *pLVar2;
  undefined1 local_60 [8];
  StringOutputStream output_stream;
  LogMessage local_38;
  Voidify local_21;
  string *local_20;
  string *output_local;
  Message *message_local;
  Printer *this_local;
  
  local_20 = output;
  output_local = (string *)message;
  message_local = (Message *)this;
  if (output != (string *)0x0) {
    std::__cxx11::string::clear();
    io::StringOutputStream::StringOutputStream((StringOutputStream *)local_60,local_20);
    bVar1 = Print(this,(Message *)output_local,(ZeroCopyOutputStream *)local_60,kMemberPrintToString
                 );
    io::StringOutputStream::~StringOutputStream((StringOutputStream *)local_60);
    return bVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
             ,0x8af,"output");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [28])"output specified is nullptr");
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

bool TextFormat::Printer::PrintToString(const Message& message,
                                        std::string* output) const {
  ABSL_DCHECK(output) << "output specified is nullptr";

  output->clear();
  io::StringOutputStream output_stream(output);

  return Print(message, &output_stream,
               internal::FieldReporterLevel::kMemberPrintToString);
}